

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

UnpackedRecord * sqlite3VdbeAllocUnpackedRecord(KeyInfo *pKeyInfo)

{
  int nByte;
  UnpackedRecord *p;
  KeyInfo *pKeyInfo_local;
  
  pKeyInfo_local =
       (KeyInfo *)
       sqlite3DbMallocRaw(pKeyInfo->db,(long)(int)((pKeyInfo->nKeyField + 1) * 0x38 + 0x28));
  if (pKeyInfo_local == (KeyInfo *)0x0) {
    pKeyInfo_local = (KeyInfo *)0x0;
  }
  else {
    *(KeyInfo **)&pKeyInfo_local->nAllField = pKeyInfo_local + 1;
    *(KeyInfo **)pKeyInfo_local = pKeyInfo;
    *(u16 *)((long)&pKeyInfo_local->aSortFlags + 4) = pKeyInfo->nKeyField + 1;
  }
  return (UnpackedRecord *)pKeyInfo_local;
}

Assistant:

SQLITE_PRIVATE UnpackedRecord *sqlite3VdbeAllocUnpackedRecord(
  KeyInfo *pKeyInfo               /* Description of the record */
){
  UnpackedRecord *p;              /* Unpacked record to return */
  int nByte;                      /* Number of bytes required for *p */
  nByte = ROUND8P(sizeof(UnpackedRecord)) + sizeof(Mem)*(pKeyInfo->nKeyField+1);
  p = (UnpackedRecord *)sqlite3DbMallocRaw(pKeyInfo->db, nByte);
  if( !p ) return 0;
  p->aMem = (Mem*)&((char*)p)[ROUND8P(sizeof(UnpackedRecord))];
  assert( pKeyInfo->aSortFlags!=0 );
  p->pKeyInfo = pKeyInfo;
  p->nField = pKeyInfo->nKeyField + 1;
  return p;
}